

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * attribute_context(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  int iVar1;
  longlong lVar2;
  token *ptVar3;
  expression *local_58;
  expression *expr;
  expression *peStack_48;
  int argc;
  expression *args [3];
  context *context;
  decl_state *ctx_local;
  symbol *attr_local;
  token *token_local;
  dmr_C *C_local;
  
  args[2] = (expression *)dmrC_allocator_allocate(&C->S->context_allocator,0);
  expr._4_4_ = 0;
  attr_local = (symbol *)dmrC_expect_token(C,token,0x28,"after context attribute");
  while (iVar1 = dmrC_match_op((token *)attr_local,0x29), iVar1 == 0) {
    local_58 = (expression *)0x0;
    attr_local = (symbol *)dmrC_conditional_expression(C,(token *)attr_local,&local_58);
    if (local_58 == (expression *)0x0) break;
    if (expr._4_4_ < 3) {
      *(expression **)((long)&stack0xffffffffffffffb8 + (long)expr._4_4_ * 8) = local_58;
      expr._4_4_ = expr._4_4_ + 1;
    }
    iVar1 = dmrC_match_op((token *)attr_local,0x2c);
    if (iVar1 == 0) break;
    attr_local = *(symbol **)&(attr_local->pos).field_0x4;
  }
  switch(expr._4_4_) {
  case 0:
    dmrC_sparse_error(C,*(position *)attr_local,"expected context input/output values");
    break;
  case 1:
    lVar2 = dmrC_get_expression_value(C,peStack_48);
    *(int *)&args[2]->pos = (int)lVar2;
    break;
  case 2:
    lVar2 = dmrC_get_expression_value(C,peStack_48);
    *(int *)&args[2]->pos = (int)lVar2;
    lVar2 = dmrC_get_expression_value(C,args[0]);
    *(int *)&(args[2]->pos).field_0x4 = (int)lVar2;
    break;
  case 3:
    *(expression **)args[2] = peStack_48;
    lVar2 = dmrC_get_expression_value(C,args[0]);
    *(int *)&args[2]->pos = (int)lVar2;
    lVar2 = dmrC_get_expression_value(C,args[1]);
    *(int *)&(args[2]->pos).field_0x4 = (int)lVar2;
  }
  if (expr._4_4_ != 0) {
    dmrC_add_context(C,&(ctx->ctype).contexts,(context *)args[2]);
  }
  ptVar3 = dmrC_expect_token(C,(token *)attr_local,0x29,"after context attribute");
  return ptVar3;
}

Assistant:

static struct token *attribute_context(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) attr;
	struct context *context = (struct context *)dmrC_allocator_allocate(&C->S->context_allocator, 0);
	struct expression *args[3];
	int argc = 0;

	token = dmrC_expect_token(C, token, '(', "after context attribute");
	while (!dmrC_match_op(token, ')')) {
		struct expression *expr = NULL;
		token = dmrC_conditional_expression(C, token, &expr);
		if (!expr)
			break;
		if (argc < 3)
			args[argc++] = expr;
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}

	switch(argc) {
	case 0:
		dmrC_sparse_error(C, token->pos, "expected context input/output values");
		break;
	case 1:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		break;
	case 2:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[1]);
		break;
	case 3:
		context->context_expr = args[0];
		context->in = (unsigned int)dmrC_get_expression_value(C, args[1]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[2]);
		break;
	}

	if (argc)
		dmrC_add_context(C, &ctx->ctype.contexts, context);

	token = dmrC_expect_token(C, token, ')', "after context attribute");
	return token;
}